

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigUtil.c
# Opt level: O3

Vec_Ptr_t * Aig_ManMuxesCollect(Aig_Man_t *pAig)

{
  Aig_Obj_t *pNode;
  int iVar1;
  Vec_Ptr_t *pVVar2;
  void **ppvVar3;
  Vec_Ptr_t *pVVar4;
  long lVar5;
  ulong uVar6;
  int iVar7;
  long lVar8;
  
  pVVar2 = (Vec_Ptr_t *)malloc(0x10);
  pVVar2->nCap = 100;
  pVVar2->nSize = 0;
  ppvVar3 = (void **)malloc(800);
  pVVar2->pArray = ppvVar3;
  pVVar4 = pAig->vObjs;
  if (0 < pVVar4->nSize) {
    iVar7 = 0;
    uVar6 = 100;
    lVar8 = 0;
    do {
      pNode = (Aig_Obj_t *)pVVar4->pArray[lVar8];
      if ((pNode != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pNode->field_0x18 & 7) - 7)) {
        iVar1 = Aig_ObjIsMuxType(pNode);
        if (iVar1 != 0) {
          iVar1 = (int)uVar6;
          if (iVar7 == iVar1) {
            if (iVar1 < 0x10) {
              if (pVVar2->pArray == (void **)0x0) {
                ppvVar3 = (void **)malloc(0x80);
              }
              else {
                ppvVar3 = (void **)realloc(pVVar2->pArray,0x80);
              }
              pVVar2->pArray = ppvVar3;
              pVVar2->nCap = 0x10;
              uVar6 = 0x10;
            }
            else {
              uVar6 = (ulong)(uint)(iVar1 * 2);
              if (pVVar2->pArray == (void **)0x0) {
                ppvVar3 = (void **)malloc(uVar6 * 8);
              }
              else {
                ppvVar3 = (void **)realloc(pVVar2->pArray,uVar6 * 8);
              }
              pVVar2->pArray = ppvVar3;
              pVVar2->nCap = iVar1 * 2;
            }
          }
          else {
            ppvVar3 = pVVar2->pArray;
          }
          lVar5 = (long)iVar7;
          iVar7 = iVar7 + 1;
          pVVar2->nSize = iVar7;
          ppvVar3[lVar5] = pNode;
        }
      }
      lVar8 = lVar8 + 1;
      pVVar4 = pAig->vObjs;
    } while (lVar8 < pVVar4->nSize);
  }
  return pVVar2;
}

Assistant:

Vec_Ptr_t * Aig_ManMuxesCollect( Aig_Man_t * pAig )
{
    Vec_Ptr_t * vMuxes;
    Aig_Obj_t * pObj;
    int i;
    vMuxes = Vec_PtrAlloc( 100 );
    Aig_ManForEachNode( pAig, pObj, i )
        if ( Aig_ObjIsMuxType(pObj) )
            Vec_PtrPush( vMuxes, pObj );
    return vMuxes;
}